

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O3

int xmlUCSIsCatPf(int code)

{
  uint uVar1;
  
  uVar1 = 1;
  if (((code != 0xbb) && (code != 0x2019)) && (code != 0x201d)) {
    uVar1 = (uint)(code == 0x203a);
  }
  return uVar1;
}

Assistant:

int
xmlUCSIsCatPf(int code) {
    return((code == 0xbb) ||
           (code == 0x2019) ||
           (code == 0x201d) ||
           (code == 0x203a));
}